

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMLSParserImpl::startDocument(DOMLSParserImpl *this)

{
  XMLScanner *this_00;
  DOMDocumentImpl *pDVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  DOMNode *pDVar5;
  long *plVar6;
  XMLCh *pXVar7;
  void *pvVar8;
  XMLStringPool *pXVar9;
  undefined8 uVar10;
  undefined4 extraout_var_01;
  uint *puVar11;
  Locator *pLVar12;
  undefined4 extraout_var_02;
  ReaderMgr *this_01;
  DOMDocumentImpl *local_c8;
  XMLCh *prefix;
  ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::StringHasher> iter;
  DOMNode *attr;
  XMLSize_t i;
  DOMNamedNodeMap *attrs;
  DOMNode *local_48;
  DOMNode *cursor;
  ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> inScopeNS;
  DOMLSParserImpl *this_local;
  undefined4 extraout_var_00;
  
  inScopeNS._40_8_ = this;
  if (this->fWrapNodesInDocumentFragment == (DOMDocumentFragment *)0x0) {
    AbstractDOMParser::startDocument(&this->super_AbstractDOMParser);
  }
  else {
    iVar3 = (*(this->fWrapNodesInDocumentFragment->super_DOMNode)._vptr_DOMNode[0xc])();
    if (CONCAT44(extraout_var,iVar3) == 0) {
      local_c8 = (DOMDocumentImpl *)0x0;
    }
    else {
      local_c8 = (DOMDocumentImpl *)(CONCAT44(extraout_var,iVar3) + -8);
    }
    (this->super_AbstractDOMParser).fDocument = local_c8;
    pDVar5 = &this->fWrapNodesInDocumentFragment->super_DOMNode;
    (this->super_AbstractDOMParser).fCurrentNode = pDVar5;
    (this->super_AbstractDOMParser).fCurrentParent = pDVar5;
    DOMDocumentImpl::setErrorChecking((this->super_AbstractDOMParser).fDocument,false);
    ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::ValueHashTableOf
              ((ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *)&cursor,7,
               (this->super_AbstractDOMParser).fMemoryManager);
    local_48 = this->fWrapNodesContext;
    while (local_48 != (DOMNode *)0x0) {
      iVar3 = (*local_48->_vptr_DOMNode[4])();
      if (iVar3 == 1) {
        iVar3 = (*local_48->_vptr_DOMNode[0xb])();
        plVar4 = (long *)CONCAT44(extraout_var_00,iVar3);
        for (attr = (DOMNode *)0x0; pDVar5 = (DOMNode *)(**(code **)(*plVar4 + 0x28))(),
            attr < pDVar5; attr = (DOMNode *)((long)&attr->_vptr_DOMNode + 1)) {
          plVar6 = (long *)(**(code **)(*plVar4 + 0x18))(plVar4,attr);
          pXVar7 = (XMLCh *)(**(code **)(*plVar6 + 0xb0))();
          bVar2 = XMLString::equals(pXVar7,(XMLCh *)XMLUni::fgXMLNSURIName);
          if (bVar2) {
            pvVar8 = (void *)(**(code **)(*plVar6 + 0xc0))();
            bVar2 = ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::containsKey
                              ((ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *)&cursor,
                               pvVar8);
            if (bVar2) goto LAB_003b0097;
            pvVar8 = (void *)(**(code **)(*plVar6 + 0xc0))();
            pXVar9 = XMLScanner::getURIStringPool((this->super_AbstractDOMParser).fScanner);
            uVar10 = (**(code **)(*plVar6 + 0x18))();
            iter.fMemoryManager._4_4_ =
                 (*(pXVar9->super_XSerializable)._vptr_XSerializable[5])(pXVar9,uVar10);
            ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::put
                      ((ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *)&cursor,pvVar8,
                       (uint *)((long)&iter.fMemoryManager + 4));
          }
          else {
LAB_003b0097:
            pXVar7 = (XMLCh *)(**(code **)(*plVar6 + 0x10))();
            bVar2 = XMLString::equals(pXVar7,(XMLCh *)XMLUni::fgXMLNSString);
            if ((bVar2) &&
               (bVar2 = ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::containsKey
                                  ((ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *)
                                   &cursor,&XMLUni::fgZeroLenString), !bVar2)) {
              pXVar9 = XMLScanner::getURIStringPool((this->super_AbstractDOMParser).fScanner);
              uVar10 = (**(code **)(*plVar6 + 0x18))();
              iter.fMemoryManager._0_4_ =
                   (*(pXVar9->super_XSerializable)._vptr_XSerializable[5])(pXVar9,uVar10);
              ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::put
                        ((ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *)&cursor,
                         &XMLUni::fgZeroLenString,(uint *)&iter.fMemoryManager);
            }
          }
        }
      }
      iVar3 = (*local_48->_vptr_DOMNode[5])();
      local_48 = (DOMNode *)CONCAT44(extraout_var_01,iVar3);
    }
    ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::StringHasher>::ValueHashTableOfEnumerator
              ((ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::StringHasher> *)&prefix,
               (ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *)&cursor,false,
               (this->super_AbstractDOMParser).fMemoryManager);
    while (bVar2 = ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::StringHasher>::
                   hasMoreElements((ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::StringHasher>
                                    *)&prefix), bVar2) {
      pXVar7 = (XMLCh *)ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::StringHasher>::
                        nextElementKey((ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::StringHasher>
                                        *)&prefix);
      this_00 = (this->super_AbstractDOMParser).fScanner;
      puVar11 = ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::get
                          ((ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *)&cursor,
                           pXVar7,XMLPlatformUtils::fgMemoryManager);
      XMLScanner::addGlobalPrefix(this_00,pXVar7,*puVar11);
    }
    if ((this->fWrapNodesAction == ACTION_REPLACE_CHILDREN) &&
       (iVar3 = (*this->fWrapNodesContext->_vptr_DOMNode[4])(), iVar3 == 9)) {
      pDVar1 = (this->super_AbstractDOMParser).fDocument;
      pLVar12 = XMLScanner::getLocator((this->super_AbstractDOMParser).fScanner);
      iVar3 = (*pLVar12->_vptr_Locator[3])();
      (*(pDVar1->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x5d])
                (pDVar1,CONCAT44(extraout_var_02,iVar3));
      pDVar1 = (this->super_AbstractDOMParser).fDocument;
      this_01 = XMLScanner::getReaderMgr((this->super_AbstractDOMParser).fScanner);
      pXVar7 = ReaderMgr::getCurrentEncodingStr(this_01);
      DOMDocumentImpl::setInputEncoding(pDVar1,pXVar7);
    }
    ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::StringHasher>::~ValueHashTableOfEnumerator
              ((ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::StringHasher> *)&prefix);
    ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::~ValueHashTableOf
              ((ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *)&cursor);
  }
  return;
}

Assistant:

void DOMLSParserImpl::startDocument()
{
    if(fWrapNodesInDocumentFragment)
    {
        fDocument = (DOMDocumentImpl*)fWrapNodesInDocumentFragment->getOwnerDocument();
        fCurrentParent = fCurrentNode = fWrapNodesInDocumentFragment;
        // set DOM error checking off
        fDocument->setErrorChecking(false);

        // if we have namespaces in scope, push them down to the reader
        ValueHashTableOf<unsigned int> inScopeNS(7, fMemoryManager);
        DOMNode* cursor = fWrapNodesContext;
        while(cursor)
        {
            if(cursor->getNodeType()==DOMNode::ELEMENT_NODE)
            {
                DOMNamedNodeMap* attrs = cursor->getAttributes();
                for(XMLSize_t i=0; i<attrs->getLength(); i++)
                {
                    DOMNode* attr = attrs->item(i);
                    if(XMLString::equals(attr->getNamespaceURI(), XMLUni::fgXMLNSURIName) && !inScopeNS.containsKey(attr->getLocalName()))
                        inScopeNS.put((void*)attr->getLocalName(), fScanner->getURIStringPool()->addOrFind(attr->getNodeValue()));
                    else if(XMLString::equals(attr->getNodeName(), XMLUni::fgXMLNSString) && !inScopeNS.containsKey(XMLUni::fgZeroLenString))
                        inScopeNS.put((void*)XMLUni::fgZeroLenString, fScanner->getURIStringPool()->addOrFind(attr->getNodeValue()));
                }
            }
            cursor = cursor->getParentNode();
        }
        ValueHashTableOfEnumerator<unsigned int> iter(&inScopeNS, false, fMemoryManager);
        while(iter.hasMoreElements())
        {
            XMLCh* prefix = (XMLCh*)iter.nextElementKey();
            fScanner->addGlobalPrefix(prefix, inScopeNS.get(prefix));
        }

        // in this case the document URI and the input encoding must be propagated to the context document
        if(fWrapNodesAction==ACTION_REPLACE_CHILDREN && fWrapNodesContext->getNodeType()==DOMNode::DOCUMENT_NODE)
        {
            fDocument->setDocumentURI(fScanner->getLocator()->getSystemId());
            fDocument->setInputEncoding(fScanner->getReaderMgr()->getCurrentEncodingStr());
        }
    }
    else
        AbstractDOMParser::startDocument();
}